

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::QuadraticCost::setStateHessianSparsity
          (QuadraticCost *this,SparsityStructure *stateSparsity)

{
  bool bVar1;
  SparsityStructure *in_RDI;
  SparsityStructure *in_stack_ffffffffffffffd8;
  
  bVar1 = SparsityStructure::isValid(in_RDI);
  if (bVar1) {
    *(undefined1 *)&in_RDI[1].m_register._M_h._M_rehash_policy._M_max_load_factor = 1;
    SparsityStructure::operator=(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    iDynTree::reportError
              ("QuadraticCost","setStateHessianSparsity",
               "The sparsity vectors have different number of entries.");
  }
  return bVar1;
}

Assistant:

bool iDynTree::optimalcontrol::QuadraticCost::setStateHessianSparsity(const SparsityStructure &stateSparsity)
        {
            if (!stateSparsity.isValid()) {
                reportError("QuadraticCost", "setStateHessianSparsity", "The sparsity vectors have different number of entries.");
                return false;
            }
            m_hasSecondPartialDerivativeWRTStateSparsity = true;
            m_secondPartialDerivativeWRTStateSparsity = stateSparsity;
            return true;
        }